

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::SetFromOtherSlow
          (MicroString *this,MicroString *other,Arena *arena,size_t inline_capacity)

{
  bool bVar1;
  LargeRepKind LVar2;
  string_view data;
  size_t inline_capacity_local;
  Arena *arena_local;
  MicroString *other_local;
  MicroString *this_local;
  
  bVar1 = is_large_rep(other);
  if ((bVar1) && (LVar2 = large_rep_kind(other), LVar2 == kUnowned)) {
    if (arena == (Arena *)0x0) {
      Destroy(this);
    }
    this->rep_ = other->rep_;
  }
  else {
    data = Get(other);
    SetImpl(this,data,arena,inline_capacity);
  }
  return;
}

Assistant:

void MicroString::SetFromOtherSlow(const MicroString& other, Arena* arena,
                                   size_t inline_capacity) {
  // Unowned property gets propagated, even if we have a rep already.
  if (other.is_large_rep() && other.large_rep_kind() == kUnowned) {
    if (arena == nullptr) Destroy();
    rep_ = other.rep_;
    return;
  }
  SetImpl(other.Get(), arena, inline_capacity);
}